

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O0

bool __thiscall RichHdrWrapper::wrap(RichHdrWrapper *this)

{
  RICH_SIGNATURE *pRVar1;
  RICH_DANS_HEADER *pRVar2;
  size_t sVar3;
  RichHdrWrapper *this_local;
  
  pRVar1 = PEFile::getRichHeaderSign((this->super_PEElementWrapper).m_PE);
  this->richSign = pRVar1;
  pRVar2 = PEFile::getRichHeaderBgn((this->super_PEElementWrapper).m_PE,this->richSign);
  this->dansHdr = pRVar2;
  if ((this->richSign == (RICH_SIGNATURE *)0x0) || (this->dansHdr == (RICH_DANS_HEADER *)0x0)) {
    this->compIdCounter = 0;
    this_local._7_1_ = false;
  }
  else {
    sVar3 = compIdCount(this);
    this->compIdCounter = sVar3;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RichHdrWrapper::wrap()
{
    this->richSign = m_PE->getRichHeaderSign();
    this->dansHdr = m_PE->getRichHeaderBgn(richSign);
    if (!this->richSign || !this->dansHdr) {
        this->compIdCounter = 0;
        return false;
    }
    this->compIdCounter = this->compIdCount();
    return true;
}